

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrInv.c
# Opt level: O3

int Pdr_InvCheck_int(Gia_Man_t *p,Vec_Int_t *vInv,int fVerbose,sat_solver *pSat,int fSkip)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int *piVar4;
  int iVar5;
  int iVar6;
  Vec_Int_t *p_00;
  int *piVar7;
  int *piVar8;
  int iVar9;
  sat_solver *psVar10;
  uint uVar11;
  long lVar12;
  int iVar13;
  int local_5c;
  
  piVar4 = vInv->pArray;
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 100;
  piVar7 = (int *)malloc(400);
  p_00->pArray = piVar7;
  iVar5 = sat_solver_nvars(pSat);
  iVar1 = p->nRegs;
  iVar2 = p->vCos->nSize;
  piVar7 = piVar4 + 1;
  iVar6 = *piVar4;
  iVar13 = iVar2;
  iVar9 = iVar1;
  if (0 < iVar6) {
    iVar13 = 0;
    piVar8 = piVar7;
    do {
      p_00->nSize = 0;
      iVar6 = *piVar8;
      if (iVar6 < 1) {
LAB_005f215b:
        piVar8 = p_00->pArray;
        goto joined_r0x005f2162;
      }
      lVar12 = 0;
      do {
        uVar11 = piVar8[lVar12 + 1];
        if (uVar11 != 0xffffffff) {
          if ((int)uVar11 < 0) goto LAB_005f2317;
          iVar6 = (uVar11 >> 1) + (iVar5 - iVar1);
          if (iVar6 < 0) goto LAB_005f22f8;
          Vec_IntPush(p_00,(uVar11 & 1) + iVar6 * 2 ^ 1);
          iVar6 = *piVar8;
        }
        lVar12 = lVar12 + 1;
      } while (lVar12 < iVar6);
      if ((long)p_00->nSize == 0) goto LAB_005f215b;
      iVar6 = sat_solver_addclause(pSat,p_00->pArray,p_00->pArray + p_00->nSize);
      if (iVar6 != 1) {
        __assert_fail("status == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/pdr/pdrInv.c"
                      ,0x2dc,
                      "int Pdr_InvCheck_int(Gia_Man_t *, Vec_Int_t *, int, sat_solver *, int)");
      }
      iVar13 = iVar13 + 1;
      piVar8 = piVar8 + (long)*piVar8 + 1;
      iVar6 = *piVar4;
    } while (iVar13 < iVar6);
    iVar9 = p->nRegs;
    iVar13 = p->vCos->nSize;
  }
  local_5c = 0;
  if (iVar9 < iVar13) {
    iVar6 = 2;
    uVar11 = 0;
    local_5c = 0;
    do {
      piVar8 = p_00->pArray;
      if (p_00->nCap < 1) {
        if (piVar8 == (int *)0x0) {
          piVar8 = (int *)malloc(4);
        }
        else {
          piVar8 = (int *)realloc(piVar8,4);
        }
        p_00->pArray = piVar8;
        if (piVar8 == (int *)0x0) {
          __assert_fail("p->pArray",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
        }
        p_00->nCap = 1;
      }
      *piVar8 = iVar6;
      p_00->nSize = 1;
      psVar10 = pSat;
      iVar13 = sat_solver_solve(pSat,piVar8,piVar8 + 1,0,0,0,0);
      if (iVar13 != -1) {
        if (iVar13 != 1) {
          if (iVar13 != 0) {
            __assert_fail("status == l_False",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/pdr/pdrInv.c"
                          ,0x2f3,
                          "int Pdr_InvCheck_int(Gia_Man_t *, Vec_Int_t *, int, sat_solver *, int)");
          }
          break;
        }
        if (fVerbose != 0) {
          Abc_Print((int)psVar10,"Coverage check failed for output %d.\n",(ulong)uVar11);
        }
        if (fSkip != 0) goto LAB_005f22d7;
        local_5c = local_5c + 1;
      }
      uVar11 = uVar11 + 1;
      iVar6 = iVar6 + 2;
    } while ((int)uVar11 < p->vCos->nSize - p->nRegs);
    iVar6 = *piVar4;
  }
  if (iVar6 < 1) {
    piVar8 = p_00->pArray;
    iVar6 = 0;
  }
  else {
    uVar11 = 0;
    iVar6 = 0;
    do {
      p_00->nSize = 0;
      iVar13 = *piVar7;
      if (iVar13 < 1) {
        lVar12 = 0;
      }
      else {
        lVar12 = 0;
        do {
          uVar3 = piVar7[lVar12 + 1];
          if (uVar3 != 0xffffffff) {
            if ((int)uVar3 < 0) {
LAB_005f2317:
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                            ,0x12f,"int Abc_Lit2Var(int)");
            }
            iVar13 = (uVar3 >> 1) + (iVar2 - iVar1) + 1;
            if (iVar13 < 0) {
LAB_005f22f8:
              __assert_fail("Var >= 0 && !(c >> 1)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                            ,0x12e,"int Abc_Var2Lit(int, int)");
            }
            Vec_IntPush(p_00,(uVar3 & 1) + iVar13 * 2);
            iVar13 = *piVar7;
          }
          lVar12 = lVar12 + 1;
        } while (lVar12 < iVar13);
        lVar12 = (long)p_00->nSize;
      }
      piVar8 = p_00->pArray;
      psVar10 = pSat;
      iVar13 = sat_solver_solve(pSat,piVar8,piVar8 + lVar12,0,0,0,0);
      iVar9 = (int)psVar10;
      if ((fVerbose != 0) && (iVar13 != 1)) {
        Abc_Print(iVar9,"Finished checking clause %d (out of %d)...\r",(ulong)uVar11);
      }
      if (iVar13 != -1) {
        if (iVar13 != 1) {
          if (iVar13 != 0) {
            __assert_fail("status == l_True",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/pdr/pdrInv.c"
                          ,0x307,
                          "int Pdr_InvCheck_int(Gia_Man_t *, Vec_Int_t *, int, sat_solver *, int)");
          }
          break;
        }
        if (fVerbose != 0) {
          Abc_Print(iVar9,"Inductiveness check failed for clause %d.\n",(ulong)uVar11);
        }
        if (fSkip != 0) {
joined_r0x005f2162:
          if (piVar8 != (lit *)0x0) {
LAB_005f22d7:
            free(piVar8);
          }
          free(p_00);
          return 1;
        }
        iVar6 = iVar6 + 1;
      }
      uVar11 = uVar11 + 1;
      piVar7 = piVar7 + (long)*piVar7 + 1;
    } while ((int)uVar11 < *piVar4);
  }
  if (piVar8 != (lit *)0x0) {
    free(piVar8);
  }
  free(p_00);
  return iVar6 + local_5c;
}

Assistant:

int Pdr_InvCheck_int( Gia_Man_t * p, Vec_Int_t * vInv, int fVerbose, sat_solver * pSat, int fSkip )
{
    int nBTLimit = 0;
    int fCheckProperty = 1;
    int i, k, status, nFailed = 0, nFailedOuts = 0; 
    // collect cubes
    int * pCube, * pList = Vec_IntArray(vInv);
    // create variables
    Vec_Int_t * vLits = Vec_IntAlloc(100);
    int iFoVarBeg = sat_solver_nvars(pSat) - Gia_ManRegNum(p);
    int iFiVarBeg = 1 + Gia_ManPoNum(p);
    // add cubes
    Pdr_ForEachCube( pList, pCube, i )
    {
        // collect literals
        Vec_IntClear( vLits );
        for ( k = 0; k < pCube[0]; k++ )
            if ( pCube[k+1] != -1 )
                Vec_IntPush( vLits, Abc_Var2Lit(iFoVarBeg + Abc_Lit2Var(pCube[k+1]), !Abc_LitIsCompl(pCube[k+1])) );
        if ( Vec_IntSize(vLits) == 0 )
        {
            Vec_IntFree( vLits );
            return 1;
        }
        // add it to the solver
        status = sat_solver_addclause( pSat, Vec_IntArray(vLits), Vec_IntLimit(vLits) );
        assert( status == 1 );
    }
    // verify property output
    if ( fCheckProperty )
    {
        for ( i = 0; i < Gia_ManPoNum(p); i++ )
        {
            Vec_IntFill( vLits, 1, Abc_Var2Lit(1+i, 0) );
            status = sat_solver_solve( pSat, Vec_IntArray(vLits), Vec_IntLimit(vLits), nBTLimit, 0, 0, 0 );
            if ( status == l_Undef ) // timeout
                break;
            if ( status == l_True ) // sat - property fails
            {
                if ( fVerbose )
                    Abc_Print(1, "Coverage check failed for output %d.\n", i );
                nFailedOuts++;
                if ( fSkip )
                {
                    Vec_IntFree( vLits );
                    return 1;
                }
                continue;
            }
            assert( status == l_False ); // unsat - property holds
        }
    }
    // iterate through cubes in the direct order
    Pdr_ForEachCube( pList, pCube, i )
    {
        // collect cube
        Vec_IntClear( vLits );
        for ( k = 0; k < pCube[0]; k++ )
            if ( pCube[k+1] != -1 )
                Vec_IntPush( vLits, Abc_Var2Lit(iFiVarBeg + Abc_Lit2Var(pCube[k+1]), Abc_LitIsCompl(pCube[k+1])) );
        // check if this cube intersects with the complement of other cubes in the solver
        // if it does not intersect, then it is redundant and can be skipped
        status = sat_solver_solve( pSat, Vec_IntArray(vLits), Vec_IntLimit(vLits), nBTLimit, 0, 0, 0 );
        if ( status != l_True && fVerbose )
            Abc_Print(1, "Finished checking clause %d (out of %d)...\r", i, pList[0] );
        if ( status == l_Undef ) // timeout
            break;
        if ( status == l_False ) // unsat -- correct
            continue;
        assert( status == l_True );
        if ( fVerbose )
            Abc_Print(1, "Inductiveness check failed for clause %d.\n", i );
        nFailed++;
        if ( fSkip )
        {
            Vec_IntFree( vLits );
            return 1;
        }
    }
    Vec_IntFree( vLits );
    return nFailed + nFailedOuts;
}